

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

bool __thiscall
flatbuffers::Table::VerifyField<signed_char>
          (Table *this,Verifier *verifier,voffset_t field,size_t align)

{
  bool bVar1;
  
  if ((field < *(ushort *)(this + -(long)*(int *)this)) &&
     (*(voffset_t *)(this + ((ulong)field - (long)*(int *)this)) != 0)) {
    bVar1 = VerifierTemplate<false>::VerifyField<signed_char>
                      (verifier,(uint8_t *)this,
                       *(voffset_t *)(this + ((ulong)field - (long)*(int *)this)),align);
    return bVar1;
  }
  return true;
}

Assistant:

bool VerifyField(const Verifier &verifier, voffset_t field,
                   size_t align) const {
    // Calling GetOptionalFieldOffset should be safe now thanks to
    // VerifyTable().
    auto field_offset = GetOptionalFieldOffset(field);
    // Check the actual field.
    return !field_offset || verifier.VerifyField<T>(data_, field_offset, align);
  }